

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_update.cpp
# Opt level: O3

SinkResultType __thiscall
duckdb::PhysicalUpdate::Sink
          (PhysicalUpdate *this,ExecutionContext *context,DataChunk *chunk,OperatorSinkInput *input)

{
  DataChunk *this_00;
  DataChunk *input_00;
  _Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *this_01;
  __pthread_list_t *p_Var1;
  GlobalSinkState *pGVar2;
  UpdateLocalState *this_02;
  data_ptr_t pdVar3;
  int iVar4;
  const_reference pvVar5;
  pointer pEVar6;
  const_reference pvVar7;
  reference pvVar8;
  BoundReferenceExpression *pBVar9;
  iterator iVar10;
  reference other;
  TableUpdateState *state;
  DuckTransaction *transaction;
  __buckets_ptr pp_Var11;
  TableDeleteState *state_00;
  reference pvVar12;
  ulong uVar13;
  __buckets_ptr pp_Var14;
  size_type __n;
  idx_t iVar15;
  size_type sVar16;
  __hashtable *__h;
  DataChunk *this_03;
  SelectionVector sel;
  vector<duckdb::StorageIndex,_true> column_ids;
  long row_id;
  Vector del_row_ids;
  SelectionVector local_120;
  vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_> local_108;
  ColumnFetchState local_e8;
  Vector local_98;
  
  pGVar2 = input->global_state;
  this_02 = (UpdateLocalState *)input->local_state;
  DataChunk::Flatten(chunk);
  (this_02->default_executor).chunk = chunk;
  this_00 = &this_02->update_chunk;
  DataChunk::Reset(this_00);
  (this_02->update_chunk).count = chunk->count;
  if ((this->expressions).
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->expressions).
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    __n = 0;
    do {
      pvVar5 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::operator[](&this->expressions,__n);
      pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(pvVar5);
      if ((pEVar6->super_BaseExpression).type == VALUE_DEFAULT) {
        pvVar7 = vector<duckdb::PhysicalIndex,_true>::operator[](&this->columns,__n);
        iVar15 = pvVar7->index;
        pvVar8 = vector<duckdb::Vector,_true>::operator[](&this_00->data,__n);
        ExpressionExecutor::ExecuteExpression(&this_02->default_executor,iVar15,pvVar8);
      }
      else {
        pvVar5 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                 ::operator[](&this->expressions,__n);
        pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator->(pvVar5);
        pBVar9 = BaseExpression::Cast<duckdb::BoundReferenceExpression>
                           (&pEVar6->super_BaseExpression);
        pvVar8 = vector<duckdb::Vector,_true>::operator[](&this_00->data,__n);
        pvVar12 = vector<duckdb::Vector,_true>::operator[](&chunk->data,pBVar9->index);
        Vector::Reference(pvVar8,pvVar12);
      }
      __n = __n + 1;
    } while (__n < (ulong)((long)(this->expressions).
                                 super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                 .
                                 super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->expressions).
                                 super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                 .
                                 super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  iVar4 = pthread_mutex_lock((pthread_mutex_t *)(pGVar2 + 1));
  if (iVar4 != 0) {
    ::std::__throw_system_error(iVar4);
  }
  pvVar8 = vector<duckdb::Vector,_true>::operator[]
                     (&chunk->data,
                      ((long)(chunk->data).
                             super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                             super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)(chunk->data).
                             super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                             super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                             _M_impl.super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5 - 1
                     );
  input_00 = &this_02->mock_chunk;
  if (this->update_is_del_and_insert == false) {
    if ((this->return_chunk == true) &&
       ((this_02->mock_chunk).count = (this_02->update_chunk).count,
       (this->columns).super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
       super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>._M_impl.
       super__Vector_impl_data._M_finish !=
       (this->columns).super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
       super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>._M_impl.
       super__Vector_impl_data._M_start)) {
      sVar16 = 0;
      do {
        pvVar7 = vector<duckdb::PhysicalIndex,_true>::operator[](&this->columns,sVar16);
        pvVar12 = vector<duckdb::Vector,_true>::operator[](&input_00->data,pvVar7->index);
        other = vector<duckdb::Vector,_true>::operator[](&this_00->data,sVar16);
        Vector::Reference(pvVar12,other);
        sVar16 = sVar16 + 1;
      } while (sVar16 < (ulong)((long)(this->columns).
                                      super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>
                                      .
                                      super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(this->columns).
                                      super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>
                                      .
                                      super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 3));
    }
    state = UpdateLocalState::GetUpdateState(this_02,this->table,this->tableref,context->client);
    DataTable::Update(this->table,state,context->client,pvVar8,&this->columns,this_00);
    if (this->return_chunk == true) {
      ColumnDataCollection::Append
                ((ColumnDataCollection *)&pGVar2[2].super_StateWithBlockableTasks.lock,input_00);
    }
    p_Var1 = &pGVar2[1].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__data.__list
    ;
    p_Var1->__prev = (__pthread_internal_list *)((long)&p_Var1->__prev->__prev + chunk->count);
  }
  else {
    SelectionVector::SelectionVector(&local_120,(this_02->update_chunk).count);
    if ((this_02->update_chunk).count == 0) {
      iVar15 = 0;
    }
    else {
      pdVar3 = pvVar8->data;
      this_01 = (_Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&pGVar2[1].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__data.
                    __list.__next;
      uVar13 = 0;
      iVar15 = 0;
      do {
        local_e8.handles._M_h._M_buckets = *(__buckets_ptr *)(pdVar3 + uVar13 * 8);
        iVar10 = ::std::
                 _Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 ::find(this_01,(key_type_conflict2 *)&local_e8);
        if (iVar10.super__Node_iterator_base<long,_false>._M_cur == (__node_type *)0x0) {
          local_98._0_8_ = this_01;
          ::std::
          _Hashtable<long,long,std::allocator<long>,std::__detail::_Identity,std::equal_to<long>,std::hash<long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::
          _M_insert<long_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<long,false>>>>
                    ((_Hashtable<long,long,std::allocator<long>,std::__detail::_Identity,std::equal_to<long>,std::hash<long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      *)this_01,&local_e8,&local_98);
          local_120.sel_vector[iVar15] = (sel_t)uVar13;
          iVar15 = iVar15 + 1;
        }
        uVar13 = uVar13 + 1;
      } while (uVar13 < (this_02->update_chunk).count);
    }
    Vector::Vector(&local_98,pvVar8);
    if (iVar15 != (this_02->update_chunk).count) {
      DataChunk::Slice(this_00,&local_120,iVar15);
      Vector::Slice(&local_98,pvVar8,&local_120,iVar15);
    }
    this_03 = &this_02->delete_chunk;
    if (this->index_update == false) {
      this_03 = input_00;
    }
    DataChunk::Reset(this_03);
    this_03->count = iVar15;
    if (this->index_update == true) {
      transaction = DuckTransaction::Get(context->client,this->table->db);
      local_108.super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_108.super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_108.super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pp_Var14 = (__buckets_ptr)0x0;
      while (local_e8.handles._M_h._M_buckets = pp_Var14,
            pp_Var11 = (__buckets_ptr)DataTable::ColumnCount(this->table), pp_Var14 < pp_Var11) {
        ::std::vector<duckdb::StorageIndex,std::allocator<duckdb::StorageIndex>>::
        emplace_back<unsigned_long&>
                  ((vector<duckdb::StorageIndex,std::allocator<duckdb::StorageIndex>> *)&local_108,
                   (unsigned_long *)&local_e8);
        pp_Var14 = (__buckets_ptr)((long)local_e8.handles._M_h._M_buckets + 1);
      }
      local_e8.handles._M_h._M_buckets = &local_e8.handles._M_h._M_single_bucket;
      local_e8.handles._M_h._M_bucket_count = 1;
      local_e8.handles._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_e8.handles._M_h._M_element_count = 0;
      local_e8.handles._M_h._M_rehash_policy._M_max_load_factor = 1.0;
      local_e8.handles._M_h._M_rehash_policy._4_4_ = 0;
      local_e8.handles._M_h._M_rehash_policy._M_next_resize = 0;
      local_e8.handles._M_h._M_single_bucket = (__node_base_ptr)0x0;
      local_e8.child_states.
      super_vector<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_e8.child_states.
      super_vector<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_e8.child_states.
      super_vector<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      DataTable::Fetch(this->table,transaction,this_03,
                       (vector<duckdb::StorageIndex,_true> *)&local_108,pvVar8,iVar15,&local_e8);
      ::std::
      vector<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>_>_>
      ::~vector(&local_e8.child_states.
                 super_vector<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>_>_>
               );
      ::std::
      _Hashtable<long,_std::pair<const_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable((_Hashtable<long,_std::pair<const_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)&local_e8);
      ::std::vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>::~vector
                (&local_108);
    }
    state_00 = UpdateLocalState::GetDeleteState(this_02,this->table,this->tableref,context->client);
    DataTable::Delete(this->table,state_00,context->client,&local_98,iVar15);
    (this_02->mock_chunk).count = iVar15;
    if ((this->columns).super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
        super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (this->columns).super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
        super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>._M_impl.
        super__Vector_impl_data._M_start) {
      sVar16 = 0;
      do {
        pvVar7 = vector<duckdb::PhysicalIndex,_true>::operator[](&this->columns,sVar16);
        pvVar8 = vector<duckdb::Vector,_true>::operator[](&input_00->data,pvVar7->index);
        pvVar12 = vector<duckdb::Vector,_true>::operator[](&this_00->data,sVar16);
        Vector::Reference(pvVar8,pvVar12);
        sVar16 = sVar16 + 1;
      } while (sVar16 < (ulong)((long)(this->columns).
                                      super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>
                                      .
                                      super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(this->columns).
                                      super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>
                                      .
                                      super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 3));
    }
    DataTable::LocalAppend
              (this->table,this->tableref,context->client,input_00,&this->bound_constraints,
               &local_98,this_03);
    if (this->return_chunk == true) {
      ColumnDataCollection::Append
                ((ColumnDataCollection *)&pGVar2[2].super_StateWithBlockableTasks.lock,input_00);
    }
    p_Var1 = &pGVar2[1].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__data.__list
    ;
    p_Var1->__prev = (__pthread_internal_list *)((long)&p_Var1->__prev->__prev + chunk->count);
    if (local_98.auxiliary.internal.
        super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_98.auxiliary.internal.
                 super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_98.buffer.internal.
        super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_98.buffer.internal.
                 super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    LogicalType::~LogicalType((LogicalType *)((long)&local_98 + 8));
    if (local_120.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_120.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)(pGVar2 + 1));
  return NEED_MORE_INPUT;
}

Assistant:

SinkResultType PhysicalUpdate::Sink(ExecutionContext &context, DataChunk &chunk, OperatorSinkInput &input) const {
	auto &g_state = input.global_state.Cast<UpdateGlobalState>();
	auto &l_state = input.local_state.Cast<UpdateLocalState>();

	chunk.Flatten();
	l_state.default_executor.SetChunk(chunk);

	DataChunk &update_chunk = l_state.update_chunk;
	update_chunk.Reset();
	update_chunk.SetCardinality(chunk);

	for (idx_t i = 0; i < expressions.size(); i++) {
		// Default expression, set to the default value of the column.
		if (expressions[i]->GetExpressionType() == ExpressionType::VALUE_DEFAULT) {
			l_state.default_executor.ExecuteExpression(columns[i].index, update_chunk.data[i]);
			continue;
		}

		D_ASSERT(expressions[i]->GetExpressionType() == ExpressionType::BOUND_REF);
		auto &binding = expressions[i]->Cast<BoundReferenceExpression>();
		update_chunk.data[i].Reference(chunk.data[binding.index]);
	}

	lock_guard<mutex> glock(g_state.lock);
	auto &row_ids = chunk.data[chunk.ColumnCount() - 1];
	DataChunk &mock_chunk = l_state.mock_chunk;

	// Regular in-place update.
	if (!update_is_del_and_insert) {
		if (return_chunk) {
			mock_chunk.SetCardinality(update_chunk);
			for (idx_t i = 0; i < columns.size(); i++) {
				mock_chunk.data[columns[i].index].Reference(update_chunk.data[i]);
			}
		}
		auto &update_state = l_state.GetUpdateState(table, tableref, context.client);
		table.Update(update_state, context.client, row_ids, columns, update_chunk);

		if (return_chunk) {
			g_state.return_collection.Append(mock_chunk);
		}
		g_state.updated_count += chunk.size();
		return SinkResultType::NEED_MORE_INPUT;
	}

	// We update an index or a complex type, so we need to split the UPDATE into DELETE + INSERT.

	// Keep track of the rows that have not yet been deleted in this UPDATE.
	// This is required since we might see the same row_id multiple times, e.g.,
	// during an UPDATE containing joins.
	SelectionVector sel(update_chunk.size());
	idx_t update_count = 0;
	auto row_id_data = FlatVector::GetData<row_t>(row_ids);

	for (idx_t i = 0; i < update_chunk.size(); i++) {
		auto row_id = row_id_data[i];
		if (g_state.updated_rows.find(row_id) == g_state.updated_rows.end()) {
			g_state.updated_rows.insert(row_id);
			sel.set_index(update_count++, i);
		}
	}

	// The update chunk now contains exactly those rows that we are deleting.
	Vector del_row_ids(row_ids);
	if (update_count != update_chunk.size()) {
		update_chunk.Slice(sel, update_count);
		del_row_ids.Slice(row_ids, sel, update_count);
	}

	auto &delete_chunk = index_update ? l_state.delete_chunk : l_state.mock_chunk;
	delete_chunk.Reset();
	delete_chunk.SetCardinality(update_count);

	if (index_update) {
		auto &transaction = DuckTransaction::Get(context.client, table.db);
		vector<StorageIndex> column_ids;
		for (idx_t i = 0; i < table.ColumnCount(); i++) {
			column_ids.emplace_back(i);
		};
		// We need to fetch the previous index keys to add them to the delete index.
		auto fetch_state = ColumnFetchState();
		table.Fetch(transaction, delete_chunk, column_ids, row_ids, update_count, fetch_state);
	}

	auto &delete_state = l_state.GetDeleteState(table, tableref, context.client);
	table.Delete(delete_state, context.client, del_row_ids, update_count);

	// Arrange the columns in the standard table order.
	mock_chunk.SetCardinality(update_count);
	for (idx_t i = 0; i < columns.size(); i++) {
		mock_chunk.data[columns[i].index].Reference(update_chunk.data[i]);
	}

	table.LocalAppend(tableref, context.client, mock_chunk, bound_constraints, del_row_ids, delete_chunk);
	if (return_chunk) {
		g_state.return_collection.Append(mock_chunk);
	}

	g_state.updated_count += chunk.size();
	return SinkResultType::NEED_MORE_INPUT;
}